

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

int ecp_mul_restartable_internal
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_mpi *m,mbedtls_ecp_point *P,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,mbedtls_ecp_restart_ctx *rs_ctx
              )

{
  mbedtls_mpi *X;
  mbedtls_ecp_point *P_00;
  int iVar1;
  int iVar2;
  int iVar3;
  mbedtls_ecp_point *P_01;
  ulong uVar4;
  mbedtls_ecp_point *P_02;
  ulong uVar5;
  size_t sVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  uchar i;
  ulong uVar12;
  mbedtls_mpi *X_00;
  long lVar13;
  uchar uStack_199;
  mbedtls_mpi local_198 [9];
  undefined1 local_108 [8];
  mbedtls_mpi M;
  undefined1 local_c0 [8];
  mbedtls_ecp_point Txi;
  ulong local_40;
  mbedtls_mpi *pmVar11;
  
  pmVar11 = (mbedtls_mpi *)f_rng;
  iVar1 = mbedtls_ecp_check_privkey(grp,m);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = mbedtls_ecp_check_pubkey(grp,P);
  if (iVar1 != 0) {
    return iVar1;
  }
  if ((grp->G).X.p == (mbedtls_mpi_uint *)0x0) {
    return -0x4f80;
  }
  if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
    return -0x4f80;
  }
  sVar6 = grp->nbits;
  P_01 = (mbedtls_ecp_point *)calloc(2,0x30);
  if (P_01 == (mbedtls_ecp_point *)0x0) {
    iVar1 = -0x4d80;
    goto LAB_00218115;
  }
  uVar5 = sVar6 + 1;
  uVar4 = uVar5 >> 1;
  mbedtls_mpi_init((mbedtls_mpi *)P_01);
  mbedtls_mpi_init(&P_01->Y);
  X = &P_01->Z;
  mbedtls_mpi_init(X);
  P_00 = P_01 + 1;
  mbedtls_mpi_init(&P_00->X);
  Txi.Z._8_8_ = &P_01[1].Y;
  mbedtls_mpi_init((mbedtls_mpi *)Txi.Z._8_8_);
  X_00 = &P_01[1].Z;
  mbedtls_mpi_init(X_00);
  lVar13 = 0;
  do {
    mbedtls_mpi_init((mbedtls_mpi *)((long)&local_198[0].p + lVar13));
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0x40);
  iVar1 = mbedtls_ecp_copy(P_01,P);
  if (iVar1 == 0) {
    if (1 < uVar5) {
      uVar12 = 0;
      do {
        if (((uVar12 == 0) && (iVar1 = mbedtls_ecp_copy(P_00,P_01), iVar1 != 0)) ||
           (iVar1 = ecp_double_jac(grp,P_00,P_00,local_198), iVar1 != 0)) goto LAB_00217ee3;
        uVar12 = uVar12 + 1;
      } while (uVar4 != uVar12);
    }
    iVar1 = ecp_normalize_jac(grp,P_00);
    if (iVar1 == 0) {
      lVar13 = -2;
      P_02 = P_01;
      do {
        lVar13 = lVar13 + 1;
        if (lVar13 == 0) {
          iVar1 = ecp_normalize_jac(grp,P_00);
          if (iVar1 == 0) {
            mbedtls_mpi_free(X);
            mbedtls_mpi_free(X_00);
            iVar1 = 0;
          }
          break;
        }
        pmVar11 = local_198;
        iVar1 = ecp_add_mixed(grp,P_02 + 1,P_02,P_00,local_198);
        P_02 = P_02 + -1;
      } while (iVar1 == 0);
    }
  }
LAB_00217ee3:
  lVar13 = 0;
  do {
    mbedtls_mpi_free((mbedtls_mpi *)((long)&local_198[0].p + lVar13));
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0x40);
  if (iVar1 == 0) {
    mbedtls_mpi_init((mbedtls_mpi *)local_108);
    mbedtls_mpi_init((mbedtls_mpi *)local_c0);
    iVar1 = mbedtls_mpi_get_bit(&grp->N,0);
    if (iVar1 == 1) {
      iVar2 = mbedtls_mpi_get_bit(m,0);
      iVar1 = mbedtls_mpi_copy((mbedtls_mpi *)local_108,m);
      if (((iVar1 == 0) &&
          (iVar1 = mbedtls_mpi_sub_mpi((mbedtls_mpi *)local_c0,&grp->N,m), iVar1 == 0)) &&
         (iVar1 = mbedtls_mpi_safe_cond_assign
                            ((mbedtls_mpi *)local_108,(mbedtls_mpi *)local_c0,iVar2 == 0),
         iVar1 == 0)) {
        iVar1 = 0;
        memset(local_198,0,uVar4 + 1);
        if (1 < uVar5) {
          sVar6 = 0;
          do {
            iVar1 = mbedtls_mpi_get_bit((mbedtls_mpi *)local_108,sVar6);
            bVar9 = *(byte *)((long)&local_198[0].p + sVar6);
            iVar3 = mbedtls_mpi_get_bit((mbedtls_mpi *)local_108,uVar4 + sVar6);
            *(byte *)((long)&local_198[0].p + sVar6) = (char)iVar3 * '\x02' | (byte)iVar1 | bVar9;
            sVar6 = sVar6 + 1;
          } while (uVar4 != sVar6);
          iVar1 = 0;
          uVar12 = 0;
          bVar9 = 0;
          do {
            bVar7 = *(byte *)((long)&local_198[0].p + uVar12 + 1);
            bVar10 = bVar7 & bVar9;
            pmVar11 = (mbedtls_mpi *)(ulong)bVar10;
            bVar7 = bVar7 ^ bVar9;
            bVar8 = (~bVar7 & 1) * (byte)local_198[0].p;
            bVar9 = bVar8 & bVar7 | bVar10;
            bVar8 = bVar7 ^ bVar8;
            *(byte *)((long)&local_198[0].p + uVar12 + 1) = bVar8;
            *(byte *)((long)&local_198[0].p + uVar12) = ~bVar7 << 7 | (byte)local_198[0].p;
            uVar12 = uVar12 + 1;
            local_198[0].p._0_1_ = bVar8;
          } while (uVar4 != uVar12);
        }
      }
      mbedtls_mpi_free((mbedtls_mpi *)local_c0);
      mbedtls_mpi_free((mbedtls_mpi *)local_108);
      if (iVar1 == 0) {
        mbedtls_mpi_init((mbedtls_mpi *)local_c0);
        mbedtls_mpi_init((mbedtls_mpi *)&Txi.X.s);
        mbedtls_mpi_init((mbedtls_mpi *)&Txi.Y.s);
        lVar13 = 0;
        do {
          mbedtls_mpi_init((mbedtls_mpi *)(local_108 + lVar13));
          lVar13 = lVar13 + 0x10;
        } while (lVar13 != 0x40);
        iVar1 = ecp_select_comb(grp,R,P_01,*(uchar *)((long)&local_198[0].p + uVar4),(uchar)pmVar11)
        ;
        if (iVar1 == 0) {
          if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
            iVar1 = 0;
            if (1 < uVar5) goto LAB_002182bd;
          }
          else {
            iVar1 = ecp_randomize_jac(grp,R,f_rng,p_rng);
            if (1 < uVar5 && iVar1 == 0) {
LAB_002182bd:
              while( true ) {
                local_40 = uVar4 - 1;
                i = (uchar)pmVar11;
                iVar1 = ecp_double_jac(grp,R,R,(mbedtls_mpi *)local_108);
                if ((iVar1 != 0) ||
                   (iVar1 = ecp_select_comb(grp,(mbedtls_ecp_point *)local_c0,P_01,
                                            (&uStack_199)[uVar4],i), iVar1 != 0)) break;
                pmVar11 = (mbedtls_mpi *)local_108;
                iVar1 = ecp_add_mixed(grp,R,R,(mbedtls_ecp_point *)local_c0,(mbedtls_mpi *)local_108
                                     );
                if ((iVar1 != 0) || (uVar4 = local_40, local_40 == 0)) break;
              }
            }
          }
        }
        mbedtls_mpi_free((mbedtls_mpi *)local_c0);
        mbedtls_mpi_free((mbedtls_mpi *)&Txi.X.s);
        mbedtls_mpi_free((mbedtls_mpi *)&Txi.Y.s);
        lVar13 = 0;
        do {
          mbedtls_mpi_free((mbedtls_mpi *)(local_108 + lVar13));
          lVar13 = lVar13 + 0x10;
        } while (lVar13 != 0x40);
        if (((iVar1 == 0) && (iVar1 = ecp_safe_invert_jac(grp,R,iVar2 == 0), iVar1 == 0)) &&
           ((f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0 ||
            (iVar1 = ecp_randomize_jac(grp,R,f_rng,p_rng), iVar1 == 0)))) {
          iVar1 = ecp_normalize_jac(grp,R);
        }
      }
    }
    else {
      iVar1 = -0x4f80;
    }
  }
  if (P_01 != grp->T) {
    mbedtls_mpi_free((mbedtls_mpi *)P_01);
    mbedtls_mpi_free(&P_01->Y);
    mbedtls_mpi_free(X);
    mbedtls_mpi_free(&P_00->X);
    mbedtls_mpi_free((mbedtls_mpi *)Txi.Z._8_8_);
    mbedtls_mpi_free(X_00);
    free(P_01);
  }
  if (iVar1 == 0) {
    return 0;
  }
LAB_00218115:
  mbedtls_ecp_point_free(R);
  return iVar1;
}

Assistant:

static int ecp_mul_restartable_internal(mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                                        const mbedtls_mpi *m, const mbedtls_ecp_point *P,
                                        int (*f_rng)(void *, unsigned char *, size_t), void *p_rng,
                                        mbedtls_ecp_restart_ctx *rs_ctx)
{
    int ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    char is_grp_capable = 0;
#endif

#if defined(MBEDTLS_ECP_RESTARTABLE)
    /* reset ops count for this call if top-level */
    if (rs_ctx != NULL && rs_ctx->depth++ == 0) {
        rs_ctx->ops_done = 0;
    }
#else
    (void) rs_ctx;
#endif

#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    if ((is_grp_capable = mbedtls_internal_ecp_grp_capable(grp))) {
        MBEDTLS_MPI_CHK(mbedtls_internal_ecp_init(grp));
    }
#endif /* MBEDTLS_ECP_INTERNAL_ALT */

    int restarting = 0;
#if defined(MBEDTLS_ECP_RESTARTABLE)
    restarting = (rs_ctx != NULL && rs_ctx->rsm != NULL);
#endif
    /* skip argument check when restarting */
    if (!restarting) {
        /* check_privkey is free */
        MBEDTLS_ECP_BUDGET(MBEDTLS_ECP_OPS_CHK);

        /* Common sanity checks */
        MBEDTLS_MPI_CHK(mbedtls_ecp_check_privkey(grp, m));
        MBEDTLS_MPI_CHK(mbedtls_ecp_check_pubkey(grp, P));
    }

    ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
#if defined(MBEDTLS_ECP_MONTGOMERY_ENABLED)
    if (mbedtls_ecp_get_type(grp) == MBEDTLS_ECP_TYPE_MONTGOMERY) {
        MBEDTLS_MPI_CHK(ecp_mul_mxz(grp, R, m, P, f_rng, p_rng));
    }
#endif
#if defined(MBEDTLS_ECP_SHORT_WEIERSTRASS_ENABLED)
    if (mbedtls_ecp_get_type(grp) == MBEDTLS_ECP_TYPE_SHORT_WEIERSTRASS) {
        MBEDTLS_MPI_CHK(ecp_mul_comb(grp, R, m, P, f_rng, p_rng, rs_ctx));
    }
#endif

cleanup:

#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    if (is_grp_capable) {
        mbedtls_internal_ecp_free(grp);
    }
#endif /* MBEDTLS_ECP_INTERNAL_ALT */

#if defined(MBEDTLS_ECP_RESTARTABLE)
    if (rs_ctx != NULL) {
        rs_ctx->depth--;
    }
#endif

    return ret;
}